

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.h
# Opt level: O2

void emitter_json_key_prefix(emitter_t *emitter)

{
  if (emitter->emitted_key == true) {
    emitter->emitted_key = false;
  }
  else {
    if (emitter->item_at_depth == true) {
      emitter_printf(emitter,",");
    }
    if (emitter->output != emitter_output_json_compact) {
      emitter_printf(emitter,anon_var_dwarf_4b0ff16 + 8);
      emitter_indent(emitter);
      return;
    }
  }
  return;
}

Assistant:

static inline void
emitter_json_key_prefix(emitter_t *emitter) {
	assert(emitter_outputs_json(emitter));
	if (emitter->emitted_key) {
		emitter->emitted_key = false;
		return;
	}
	if (emitter->item_at_depth) {
		emitter_printf(emitter, ",");
	}
	if (emitter->output != emitter_output_json_compact) {
		emitter_printf(emitter, "\n");
		emitter_indent(emitter);
	}
}